

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkReachability(Abc_Ntk_t *pNtkRel,int nIters,int fVerbose)

{
  uint *puVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pNtk2;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  int level;
  int iVar10;
  uint uVar11;
  int *piVar12;
  ulong uVar13;
  Abc_Ntk_t *pNtkNext;
  Abc_Ntk_t *pNtkReached;
  Abc_Ntk_t *pNtkFront;
  timespec ts;
  Abc_Ntk_t *local_78;
  Abc_Ntk_t *local_70;
  Abc_Ntk_t *local_68;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  timespec local_48;
  Abc_Ntk_t *local_38;
  
  local_5c = fVerbose;
  if (pNtkRel->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtkRel)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0x150,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  if (pNtkRel->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkRel) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0x151,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  if ((pNtkRel->vPis->nSize & 1) != 0) {
    __assert_fail("Abc_NtkPiNum(pNtkRel) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0x152,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  pAVar5 = Abc_NtkInitialState(pNtkRel);
  local_68 = pAVar5;
  local_70 = Abc_NtkDup(pAVar5);
  local_58 = pNtkRel->vPis->nSize;
  uVar11 = local_58 / 2;
  if (0 < nIters) {
    piVar12 = pAVar5->nObjCounts + 7;
    iVar10 = 0;
    local_38 = pNtkRel;
    do {
      local_54 = *piVar12;
      iVar4 = clock_gettime(3,&local_48);
      pAVar5 = local_68;
      if (iVar4 < 0) {
        local_50 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        local_50 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      uVar7 = 0;
      local_78 = Abc_NtkMiterAnd(pNtkRel,local_68,0,0);
      Abc_NtkDelete(pAVar5);
      if (1 < local_58) {
        uVar13 = 0;
        do {
          pAVar5 = local_78;
          iVar4 = (int)uVar13;
          Abc_NtkQuantify(local_78,0,iVar4,(int)uVar7);
          if ((int)(uVar13 / 3) * 3 + 2 == iVar4) {
            Abc_NtkCleanData(pAVar5);
            Abc_AigCleanup((Abc_Aig_t *)pAVar5->pManFunc);
            Abc_NtkSynthesize(&local_78,1);
          }
          uVar13 = (ulong)(iVar4 + 1U);
        } while (uVar11 != iVar4 + 1U);
      }
      pAVar5 = local_78;
      Abc_NtkCleanData(local_78);
      Abc_AigCleanup((Abc_Aig_t *)pAVar5->pManFunc);
      Abc_NtkSynthesize(&local_78,1);
      pAVar5 = local_78;
      pNtk = Abc_NtkSwapVariables(local_78);
      local_78 = pNtk;
      Abc_NtkDelete(pAVar5);
      if (pNtk->vPos->nSize < 1) goto LAB_00285f39;
      plVar2 = (long *)*pNtk->vPos->pArray;
      pAVar3 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      pAVar6 = Abc_AigConst1(pNtk);
      pAVar5 = local_70;
      if (pAVar3 == pAVar6) {
        puts("Fixed point is reached!");
        Abc_NtkDelete(pNtk);
        goto LAB_00285eac;
      }
      pNtk2 = Abc_NtkMiterAnd(pNtk,local_70,0,1);
      local_68 = pNtk2;
      Abc_NtkDelete(pNtk);
      local_70 = Abc_NtkMiterAnd(pAVar5,pNtk2,1,0);
      Abc_NtkDelete(pAVar5);
      Abc_NtkSynthesize(&local_68,1);
      Abc_NtkSynthesize(&local_70,1);
      pNtkRel = local_38;
      piVar12 = local_68->nObjCounts + 7;
      if (local_5c != 0) {
        iVar4 = 0x82511d;
        printf("I = %3d : Reach = %6d  Fr = %6d  FrM = %6d  %7.2f %%   ",
               ((double)(*piVar12 - local_54) * 100.0) / (double)local_54,(ulong)(iVar10 + 1),
               (ulong)(uint)local_70->nObjCounts[7]);
        Abc_Print(iVar4,"%s =","T");
        level = 3;
        iVar4 = clock_gettime(3,&local_48);
        if (iVar4 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        Abc_Print(level,"%9.2f sec\n",(double)(lVar8 + local_50) / 1000000.0);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != nIters);
  }
  fprintf(_stdout,"Reachability analysis stopped after %d iterations.\n",(ulong)(uint)nIters);
LAB_00285eac:
  pAVar5 = local_70;
  if (0 < local_70->vPos->nSize) {
    puVar1 = (uint *)((long)*local_70->vPos->pArray + 0x14);
    *puVar1 = *puVar1 ^ 0x400;
    uVar9 = uVar11 * 2;
    if ((int)uVar11 < (int)uVar9) {
      uVar13 = (ulong)uVar9;
      do {
        uVar13 = uVar13 - 1;
        if (((int)uVar9 < 1) || (pAVar5->vPis->nSize < (int)uVar9)) goto LAB_00285f39;
        pAVar3 = (Abc_Obj_t *)pAVar5->vPis->pArray[uVar13 & 0xffffffff];
        if ((pAVar3->vFanouts).nSize != 0) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                        ,0x1a0,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
        }
        Abc_NtkDeleteObj(pAVar3);
        uVar9 = uVar9 - 1;
      } while ((int)uVar11 < (int)uVar9);
    }
    iVar10 = Abc_NtkCheck(pAVar5);
    if (iVar10 == 0) {
      puts("Abc_NtkReachability: The network check has failed.");
      Abc_NtkDelete(pAVar5);
      pAVar5 = (Abc_Ntk_t *)0x0;
    }
    return pAVar5;
  }
LAB_00285f39:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkReachability( Abc_Ntk_t * pNtkRel, int nIters, int fVerbose )
{
    Abc_Obj_t * pObj;
    Abc_Ntk_t * pNtkFront, * pNtkReached, * pNtkNext, * pNtkTemp;
    int i, v, nVars, nNodesOld, nNodesNew, nNodesPrev;
    int fFixedPoint = 0;
    int fSynthesis  = 1;
    int fMoreEffort = 1;
    abctime clk;

    assert( Abc_NtkIsStrash(pNtkRel) );
    assert( Abc_NtkLatchNum(pNtkRel) == 0 );
    assert( Abc_NtkPiNum(pNtkRel) % 2 == 0 );

    // compute the network composed of the initial states
    pNtkFront = Abc_NtkInitialState( pNtkRel );
    pNtkReached = Abc_NtkDup( pNtkFront );
//Abc_NtkShow( pNtkReached, 0, 0, 0 );

//    if ( fVerbose )
//        printf( "Transition relation = %6d.\n", Abc_NtkNodeNum(pNtkRel) );

    // perform iterations of reachability analysis
    nNodesPrev = Abc_NtkNodeNum(pNtkFront);
    nVars = Abc_NtkPiNum(pNtkRel)/2;
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        // get the set of next states
        pNtkNext = Abc_NtkMiterAnd( pNtkRel, pNtkFront, 0, 0 );
        Abc_NtkDelete( pNtkFront );
        // quantify the current state variables
        for ( v = 0; v < nVars; v++ )
        {
            Abc_NtkQuantify( pNtkNext, 0, v, fVerbose );
            if ( fSynthesis && (v % 3 == 2) )
            {
                Abc_NtkCleanData( pNtkNext );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNext->pManFunc );
                Abc_NtkSynthesize( &pNtkNext, fMoreEffort );
            }
        }
        Abc_NtkCleanData( pNtkNext );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNext->pManFunc );
        if ( fSynthesis )
            Abc_NtkSynthesize( &pNtkNext, 1 );
        // map the next states into the current states
        pNtkNext = Abc_NtkSwapVariables( pNtkTemp = pNtkNext );
        Abc_NtkDelete( pNtkTemp );
        // check the termination condition
        if ( Abc_ObjFanin0(Abc_NtkPo(pNtkNext,0)) == Abc_AigConst1(pNtkNext) )
        {
            fFixedPoint = 1;
            printf( "Fixed point is reached!\n" );
            Abc_NtkDelete( pNtkNext );
            break;
        }
        // compute new front
        pNtkFront = Abc_NtkMiterAnd( pNtkNext, pNtkReached, 0, 1 );
        Abc_NtkDelete( pNtkNext );
        // add the reached states
        pNtkReached = Abc_NtkMiterAnd( pNtkTemp = pNtkReached, pNtkFront, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
        // compress the size of Front
        nNodesOld = Abc_NtkNodeNum(pNtkFront);
        if ( fSynthesis )
        {
            Abc_NtkSynthesize( &pNtkFront, fMoreEffort );
            Abc_NtkSynthesize( &pNtkReached, fMoreEffort );
        }
        nNodesNew = Abc_NtkNodeNum(pNtkFront);
        // print statistics
        if ( fVerbose )
        {
            printf( "I = %3d : Reach = %6d  Fr = %6d  FrM = %6d  %7.2f %%   ", 
                i + 1, Abc_NtkNodeNum(pNtkReached), nNodesOld, nNodesNew, 100.0*(nNodesNew-nNodesPrev)/nNodesPrev );
            ABC_PRT( "T", Abc_Clock() - clk );
        }
        nNodesPrev = Abc_NtkNodeNum(pNtkFront);
    }
    if ( !fFixedPoint )
        fprintf( stdout, "Reachability analysis stopped after %d iterations.\n", nIters );

    // complement the output to represent the set of unreachable states
    Abc_ObjXorFaninC( Abc_NtkPo(pNtkReached,0), 0 );

    // remove next state variables
    for ( i = 2*nVars - 1; i >= nVars; i-- )
    {
        pObj = Abc_NtkPi( pNtkReached, i );
        assert( Abc_ObjFanoutNum(pObj) == 0 );
        Abc_NtkDeleteObj( pObj );
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkReached ) )
    {
        printf( "Abc_NtkReachability: The network check has failed.\n" );
        Abc_NtkDelete( pNtkReached );
        return NULL;
    }
    return pNtkReached;
}